

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O3

int * Hsh_IntManLookup(Hsh_IntMan_t *p,uint *pData)

{
  int iVar1;
  Vec_Wrd_t *pVVar2;
  word *pwVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint *puVar9;
  
  iVar1 = p->nSize;
  uVar4 = p->vTable->nSize;
  if ((long)iVar1 < 1) {
    uVar7 = 0;
  }
  else {
    uVar8 = 1;
    if (1 < iVar1 * 4) {
      uVar8 = (ulong)(uint)(iVar1 * 4);
    }
    uVar6 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 + (uint)*(byte *)((long)pData + uVar6) * (&Hsh_IntManHash_s_Primes)[uVar6 % 7];
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  uVar8 = (ulong)uVar7 % (ulong)uVar4;
  iVar5 = (int)uVar8;
  if ((-1 < iVar5) && (iVar5 < (int)uVar4)) {
    puVar9 = (uint *)(p->vTable->pArray + uVar8);
    uVar4 = *puVar9;
    if (uVar4 != 0xffffffff) {
      pVVar2 = p->vObjs;
      do {
        if (((int)uVar4 < 0) || (pVVar2->nSize <= (int)uVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pwVar3 = pVVar2->pArray;
        if (pwVar3 == (word *)0x0) {
          __assert_fail("*pPlace == -1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecHsh.h"
                        ,0x9c,"int *Hsh_IntManLookup(Hsh_IntMan_t *, unsigned int *)");
        }
        pwVar3 = pwVar3 + uVar4;
        uVar4 = (int)*pwVar3 * iVar1;
        if (((int)uVar4 < 0) || (p->vData->nSize <= (int)uVar4)) goto LAB_004140ac;
        iVar5 = bcmp(pData,p->vData->pArray + uVar4,(long)iVar1 * 4);
        if (iVar5 == 0) {
          return (int *)puVar9;
        }
        uVar4 = *(uint *)((long)pwVar3 + 4);
        puVar9 = (uint *)((long)pwVar3 + 4);
      } while (uVar4 != 0xffffffff);
    }
    return (int *)puVar9;
  }
LAB_004140ac:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

static inline int * Hsh_IntManLookup( Hsh_IntMan_t * p, unsigned * pData )
{
    Hsh_IntObj_t * pObj;
    int * pPlace = Vec_IntEntryP( p->vTable, Hsh_IntManHash(pData, p->nSize, Vec_IntSize(p->vTable)) );
    for ( ; (pObj = Hsh_IntObj(p, *pPlace)); pPlace = &pObj->iNext )
        if ( !memcmp( pData, Hsh_IntData(p, pObj->iData), sizeof(int) * p->nSize ) )
            return pPlace;
    assert( *pPlace == -1 );
    return pPlace;
}